

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O0

ostream * operator<<(ostream *ostream,SSLSocket *SSLSocket)

{
  long *in_RSI;
  ostream *in_RDI;
  string local_30 [40];
  ostream *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RSI + 8))();
  std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

std::ostream &operator<<(std::ostream &ostream, blc::network::SSLSocket &SSLSocket) {
	ostream << SSLSocket.read();
	return (ostream);
}